

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_element<0>(xml_document<char> *this,char **text)

{
  xml_node<char> *this_00;
  undefined8 uVar1;
  xml_document<char> *this_01;
  char *pcVar2;
  eof_error *this_02;
  size_t sVar3;
  xml_node<char> *in_RSI;
  char **in_RDI;
  xml_document<char> *unaff_retaddr;
  size_t sz;
  char *contents_end;
  char *contents;
  char *name;
  char *prefix;
  xml_node<char> *element;
  char **in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  parse_error *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  memory_pool<char> *in_stack_ffffffffffffffb0;
  
  this_00 = memory_pool<char>::allocate_node
                      (in_stack_ffffffffffffffb0,(node_type)((ulong)in_RDI >> 0x20),
                       in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
                       ,in_stack_ffffffffffffff88);
  pcVar2 = (in_RSI->super_xml_base<char>).m_name;
  skip<rapidxml::xml_document<char>::element_name_pred,0>(in_stack_ffffffffffffff60);
  if ((in_RSI->super_xml_base<char>).m_name == pcVar2) {
    if (*(in_RSI->super_xml_base<char>).m_name != '\0') {
      uVar1 = __cxa_allocate_exception(0x18);
      parse_error::parse_error
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      __cxa_throw(uVar1,&parse_error::typeinfo,parse_error::~parse_error);
    }
    uVar1 = __cxa_allocate_exception(0x18);
    eof_error::eof_error
              ((eof_error *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
    __cxa_throw(uVar1,&eof_error::typeinfo,eof_error::~eof_error);
  }
  if (*(in_RSI->super_xml_base<char>).m_name == ':') {
    xml_node<char>::prefix
              (this_00,pcVar2,(long)(in_RSI->super_xml_base<char>).m_name - (long)pcVar2);
    (in_RSI->super_xml_base<char>).m_name = (in_RSI->super_xml_base<char>).m_name + 1;
    pcVar2 = (in_RSI->super_xml_base<char>).m_name;
    skip<rapidxml::xml_document<char>::node_name_pred,0>(in_stack_ffffffffffffff60);
    if ((in_RSI->super_xml_base<char>).m_name == pcVar2) {
      if (*(in_RSI->super_xml_base<char>).m_name != '\0') {
        uVar1 = __cxa_allocate_exception(0x18);
        parse_error::parse_error
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        __cxa_throw(uVar1,&parse_error::typeinfo,parse_error::~parse_error);
      }
      uVar1 = __cxa_allocate_exception(0x18);
      eof_error::eof_error
                ((eof_error *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60);
      __cxa_throw(uVar1,&eof_error::typeinfo,eof_error::~eof_error);
    }
    xml_base<char>::name
              (&this_00->super_xml_base<char>,pcVar2,
               (long)(in_RSI->super_xml_base<char>).m_name - (long)pcVar2);
  }
  else {
    xml_base<char>::name
              (&this_00->super_xml_base<char>,pcVar2,
               (long)(in_RSI->super_xml_base<char>).m_name - (long)pcVar2);
  }
  skip<rapidxml::xml_document<char>::whitespace_pred,0>(in_stack_ffffffffffffff60);
  parse_node_attributes<0>(unaff_retaddr,in_RDI,in_RSI);
  if (*(in_RSI->super_xml_base<char>).m_name == '>') {
    this_01 = (xml_document<char> *)((in_RSI->super_xml_base<char>).m_name + 1);
    (in_RSI->super_xml_base<char>).m_name = (char *)this_01;
    pcVar2 = parse_node_contents<0>
                       (this_01,(char **)0x0,(xml_node<char> *)in_stack_ffffffffffffffb0);
    if ((long)pcVar2 - (long)this_01 != 0) {
      xml_node<char>::contents(this_00,(char *)this_01,(long)pcVar2 - (long)this_01);
    }
  }
  else {
    if (*(in_RSI->super_xml_base<char>).m_name != '/') {
      if (*(in_RSI->super_xml_base<char>).m_name != '\0') {
        pcVar2 = (char *)__cxa_allocate_exception(0x18);
        parse_error::parse_error(in_stack_ffffffffffffff70,pcVar2,in_stack_ffffffffffffff60);
        __cxa_throw(pcVar2,&parse_error::typeinfo,parse_error::~parse_error);
      }
      this_02 = (eof_error *)__cxa_allocate_exception(0x18);
      eof_error::eof_error(this_02,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      __cxa_throw(this_02,&eof_error::typeinfo,eof_error::~eof_error);
    }
    (in_RSI->super_xml_base<char>).m_name = (in_RSI->super_xml_base<char>).m_name + 1;
    if (*(in_RSI->super_xml_base<char>).m_name != '>') {
      if (*(in_RSI->super_xml_base<char>).m_name != '\0') {
        uVar1 = __cxa_allocate_exception(0x18);
        parse_error::parse_error
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        __cxa_throw(uVar1,&parse_error::typeinfo,parse_error::~parse_error);
      }
      uVar1 = __cxa_allocate_exception(0x18);
      eof_error::eof_error
                ((eof_error *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60);
      __cxa_throw(uVar1,&eof_error::typeinfo,eof_error::~eof_error);
    }
    (in_RSI->super_xml_base<char>).m_name = (in_RSI->super_xml_base<char>).m_name + 1;
  }
  pcVar2 = xml_base<char>::name(&this_00->super_xml_base<char>);
  sVar3 = xml_base<char>::name_size(&this_00->super_xml_base<char>);
  pcVar2[sVar3] = '\0';
  pcVar2 = xml_node<char>::prefix(this_00);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = xml_node<char>::prefix(this_00);
    sVar3 = xml_node<char>::prefix_size(this_00);
    pcVar2[sVar3] = '\0';
  }
  return this_00;
}

Assistant:

xml_node<Ch> *parse_element(Ch *&text)
        {
            // Create element node
            xml_node<Ch> *element = this->allocate_node(node_element);

            // Extract element name
            Ch *prefix = text;
            skip<element_name_pred, Flags>(text);
            if (text == prefix)
                RAPIDXML_PARSE_ERROR("expected element name or prefix", text);
            if (*text == Ch(':')) {
                element->prefix(prefix, text - prefix);
                ++text;
                Ch *name = text;
                skip<node_name_pred, Flags>(text);
                if (text == name)
                    RAPIDXML_PARSE_ERROR("expected element local name", text);
                element->name(name, text - name);
            } else {
                element->name(prefix, text - prefix);
            }

            // Skip whitespace between element name and attributes or >
            skip<whitespace_pred, Flags>(text);

            // Parse attributes, if any
            parse_node_attributes<Flags>(text, element);

            // Determine ending type
            if (*text == Ch('>'))
            {
                Ch const * contents = ++text;
                Ch const * contents_end = 0;
                if (!(Flags & parse_open_only))
                    contents_end = parse_node_contents<Flags>(text, element);
                std::size_t sz = contents_end - contents;
                if (sz) element->contents(contents, sz);
            }
            else if (*text == Ch('/'))
            {
                ++text;
                if (*text != Ch('>'))
                    RAPIDXML_PARSE_ERROR("expected >", text);
                ++text;
                if (Flags & parse_open_only)
                    RAPIDXML_PARSE_ERROR("open_only, but closed", text);
            }
            else
                RAPIDXML_PARSE_ERROR("expected >", text);

            // Place zero terminator after name
            if (!(Flags & parse_no_string_terminators)) {
                element->name()[element->name_size()] = Ch('\0');
                if (element->prefix()) element->prefix()[element->prefix_size()] = Ch('\0');
            }

            // Return parsed element
            return element;
        }